

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void stable_grail_sort_dyn_buffer(int **arr,size_t Len)

{
  int **ppiVar1;
  ulong in_RSI;
  int **ExtBuf;
  int L;
  int in_stack_0000003c;
  int **in_stack_00000040;
  int in_stack_0000004c;
  int **in_stack_00000050;
  size_t in_stack_00000fd8;
  int **in_stack_00000fe0;
  undefined4 local_14;
  
  for (local_14 = 1; (ulong)(long)(local_14 * local_14) < in_RSI; local_14 = local_14 << 1) {
  }
  ppiVar1 = stable_sort_new_buffer(0x11708e);
  if (ppiVar1 == (int **)0x0) {
    stable_grail_sort_fixed_buffer(in_stack_00000fe0,in_stack_00000fd8);
  }
  else {
    stable_grail_common_sort
              (in_stack_00000050,in_stack_0000004c,in_stack_00000040,in_stack_0000003c);
    stable_sort_delete_buffer((int **)0x1170d0);
  }
  return;
}

Assistant:

void GRAIL_SORT_DYN_BUFFER(SORT_TYPE *arr, size_t Len) {
  int L = 1;
  SORT_TYPE *ExtBuf;

  while (L * L < Len) {
    L *= 2;
  }

  ExtBuf = SORT_NEW_BUFFER(L);

  if (ExtBuf == NULL) {
    GRAIL_SORT_FIXED_BUFFER(arr, Len);
  } else {
    GRAIL_COMMON_SORT(arr, (int)Len, ExtBuf, L);
    SORT_DELETE_BUFFER(ExtBuf);
  }
}